

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall cereal::JSONInputArchive::startNode(JSONInputArchive *this)

{
  bool bVar1;
  reference pvVar2;
  GenericValue *pGVar3;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_30;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_28;
  ConstValueIterator local_20;
  ConstValueIterator local_18;
  JSONInputArchive *local_10;
  JSONInputArchive *this_local;
  
  local_10 = this;
  search(this);
  pvVar2 = std::
           vector<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
           ::back(&this->itsIteratorStack);
  pGVar3 = Iterator::value(pvVar2);
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsArray(pGVar3);
  if (bVar1) {
    pvVar2 = std::
             vector<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
             ::back(&this->itsIteratorStack);
    pGVar3 = Iterator::value(pvVar2);
    local_18 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::Begin(pGVar3);
    pvVar2 = std::
             vector<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
             ::back(&this->itsIteratorStack);
    pGVar3 = Iterator::value(pvVar2);
    local_20 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::End(pGVar3);
    std::
    vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>::
    emplace_back<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const*,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const*>
              ((vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>
                *)&this->itsIteratorStack,&local_18,&local_20);
  }
  else {
    pvVar2 = std::
             vector<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
             ::back(&this->itsIteratorStack);
    pGVar3 = Iterator::value(pvVar2);
    local_28.ptr_ =
         (Pointer)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberBegin(pGVar3);
    pvVar2 = std::
             vector<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
             ::back(&this->itsIteratorStack);
    pGVar3 = Iterator::value(pvVar2);
    local_30.ptr_ =
         (Pointer)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberEnd(pGVar3);
    std::
    vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>::
    emplace_back<rapidjson::GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              ((vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>
                *)&this->itsIteratorStack,&local_28,&local_30);
  }
  return;
}

Assistant:

void startNode()
      {
        search();

        if(itsIteratorStack.back().value().IsArray())
          itsIteratorStack.emplace_back(itsIteratorStack.back().value().Begin(), itsIteratorStack.back().value().End());
        else
          itsIteratorStack.emplace_back(itsIteratorStack.back().value().MemberBegin(), itsIteratorStack.back().value().MemberEnd());
      }